

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

void __thiscall BinHash<DnsNameEntry>::Clear(BinHash<DnsNameEntry> *this)

{
  uint uVar1;
  DnsNameEntry **ppDVar2;
  DnsNameEntry **ppDVar3;
  DnsNameEntry *x;
  DnsNameEntry *pDVar4;
  ulong uVar5;
  
  ppDVar3 = this->hashBin;
  if (ppDVar3 != (DnsNameEntry **)0x0) {
    uVar1 = this->tableSize;
    if (uVar1 != 0) {
      uVar5 = 0;
      do {
        pDVar4 = ppDVar3[uVar5];
        if (pDVar4 != (DnsNameEntry *)0x0) {
          ppDVar2 = ppDVar3 + uVar5;
          do {
            *ppDVar2 = pDVar4->HashNext;
            if (pDVar4->name != (uint8_t *)0x0) {
              operator_delete__(pDVar4->name);
            }
            operator_delete(pDVar4);
            ppDVar3 = this->hashBin;
            ppDVar2 = ppDVar3 + uVar5;
            pDVar4 = *ppDVar2;
          } while (pDVar4 != (DnsNameEntry *)0x0);
          uVar1 = this->tableSize;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar1);
    }
    operator_delete__(ppDVar3);
    this->hashBin = (DnsNameEntry **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }